

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O2

CK_RV __thiscall
SoftHSM::getSymmetricKey(SoftHSM *this,SymmetricKey *skey,Token *token,OSObject *key)

{
  int iVar1;
  undefined1 uVar2;
  undefined7 uVar3;
  CK_RV CVar4;
  uchar *in_R8;
  size_t in_R9;
  ByteString local_70;
  ByteString keybits;
  
  uVar3 = (undefined7)((ulong)key >> 8);
  uVar2 = token == (Token *)0x0 || skey == (SymmetricKey *)0x0;
  if (key == (OSObject *)0x0 || (token == (Token *)0x0 || skey == (SymmetricKey *)0x0)) {
    return 7;
  }
  iVar1 = (*key->_vptr_OSObject[4])(key,2,0);
  ByteString::ByteString(&keybits);
  if ((char)iVar1 == '\0') {
    (*key->_vptr_OSObject[6])(&local_70,key,0x11);
    ByteString::operator=(&keybits,&local_70);
    ByteString::~ByteString(&local_70);
  }
  else {
    (*key->_vptr_OSObject[6])(&local_70,key,0x11);
    iVar1 = Token::decrypt(token,(EVP_PKEY_CTX *)&local_70,(uchar *)&keybits,
                           (size_t *)CONCAT71(uVar3,uVar2),in_R8,in_R9);
    ByteString::~ByteString(&local_70);
    if ((char)iVar1 == '\0') {
      CVar4 = 5;
      goto LAB_0013184b;
    }
  }
  (*(skey->super_Serialisable)._vptr_Serialisable[3])(skey,&keybits);
  CVar4 = 0;
LAB_0013184b:
  ByteString::~ByteString(&keybits);
  return CVar4;
}

Assistant:

CK_RV SoftHSM::getSymmetricKey(SymmetricKey* skey, Token* token, OSObject* key)
{
	if (skey == NULL) return CKR_ARGUMENTS_BAD;
	if (token == NULL) return CKR_ARGUMENTS_BAD;
	if (key == NULL) return CKR_ARGUMENTS_BAD;

	// Get the CKA_PRIVATE attribute, when the attribute is not present use default false
	bool isKeyPrivate = key->getBooleanValue(CKA_PRIVATE, false);

	ByteString keybits;
	if (isKeyPrivate)
	{
		if (!token->decrypt(key->getByteStringValue(CKA_VALUE), keybits))
			return CKR_GENERAL_ERROR;
	}
	else
	{
		keybits = key->getByteStringValue(CKA_VALUE);
	}

	skey->setKeyBits(keybits);

	return CKR_OK;
}